

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

void __thiscall
VulkanHppGenerator::VulkanHppGenerator(VulkanHppGenerator *this,XMLDocument *document,string *api)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int line;
  pointer pFVar3;
  pointer pEVar4;
  VulkanHppGenerator *this_00;
  pointer requiredBy;
  pointer pEVar5;
  long lVar6;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  __l;
  allocator_type local_46b;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_46a;
  bool local_469;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
  *local_468;
  vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> elements;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_390;
  undefined1 local_368 [32];
  _Base_ptr local_348;
  size_t local_340;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_338;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_308;
  _Alloc_hider local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  _Alloc_hider local_2b8;
  size_type local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  _Alloc_hider local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_238;
  bool local_208;
  undefined8 local_204;
  undefined8 uStack_1fc;
  undefined8 local_1f4;
  undefined8 uStack_1ec;
  undefined4 local_1e4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  local_1d8;
  
  std::__cxx11::string::string((string *)this,api);
  p_Var1 = &(this->m_baseTypes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_baseTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_baseTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_baseTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_baseTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_baseTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header;
  (this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_commandQueues)._M_t._M_impl.super__Rb_tree_header;
  (this->m_commandQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_commandQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_commandQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_commandQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_commandQueues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_commands)._M_t._M_impl.super__Rb_tree_header;
  (this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_constants)._M_t._M_impl.super__Rb_tree_header;
  (this->m_constants)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_constants)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_constants)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_constants)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_constants)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_468 = &this->m_defines;
  p_Var1 = &(this->m_defines)._M_t._M_impl.super__Rb_tree_header;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  DefinesPartition::DefinesPartition(&this->m_definesPartition);
  p_Var1 = &(this->m_enumExtends)._M_t._M_impl.super__Rb_tree_header;
  (this->m_enumExtends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_enumExtends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_enumExtends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_enumExtends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_enumExtends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_enums)._M_t._M_impl.super__Rb_tree_header;
  (this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_externalTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_externalTypes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_externalTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_extensions).
  super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_extensions).
  super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_extensions).
  super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_externalTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_externalTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_formats)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_formats)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_formats)._M_t._M_impl.super__Rb_tree_header;
  (this->m_externalTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_features).
  super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_features).
  super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_features).
  super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_formats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_formats)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_formats)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_funcPointers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_funcPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_funcPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_funcPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_funcPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_funcPointers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_handles)._M_t._M_impl.super__Rb_tree_header;
  (this->m_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_handles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_includes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_includes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_platforms)._M_t._M_impl.super__Rb_tree_header;
  (this->m_platforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_platforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_platforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_platforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_platforms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_RAIISpecialFunctions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_RAIISpecialFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_RAIISpecialFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_RAIISpecialFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_RAIISpecialFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_RAIISpecialFunctions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_spirVCapabilities)._M_t._M_impl.super__Rb_tree_header;
  (this->m_spirVCapabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_spirVCapabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_spirVCapabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_spirVCapabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_spirVCapabilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_structs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_syncAccesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_syncAccesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_syncAccesses)._M_t._M_impl.super__Rb_tree_header;
  (this->m_structsAliases).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_structsAliases).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_structsAliases).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_syncAccesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_syncAccesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_syncAccesses)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_syncStages)._M_t._M_impl.super__Rb_tree_header;
  (this->m_syncStages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_syncStages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_syncStages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_syncStages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_syncStages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_tags)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_types)._M_t._M_impl.super__Rb_tree_header;
  (this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_unsupportedFeatures).
  super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_unsupportedFeatures).
  super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_unsupportedExtensions).
  super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_unsupportedExtensions).
  super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_types)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_unsupportedExtensions).
  super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_unsupportedFeatures).
  super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_version)._M_dataplus._M_p = (pointer)&(this->m_version).field_2;
  (this->m_version)._M_string_length = 0;
  (this->m_version).field_2._M_local_buf[0] = '\0';
  (this->m_videoCodecs).
  super__Vector_base<VulkanHppGenerator::VideoCodec,_std::allocator<VulkanHppGenerator::VideoCodec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_videoCodecs).
  super__Vector_base<VulkanHppGenerator::VideoCodec,_std::allocator<VulkanHppGenerator::VideoCodec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_videoCodecs).
  super__Vector_base<VulkanHppGenerator::VideoCodec,_std::allocator<VulkanHppGenerator::VideoCodec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vulkanLicenseHeader)._M_dataplus._M_p = (pointer)&(this->m_vulkanLicenseHeader).field_2;
  (this->m_vulkanLicenseHeader)._M_string_length = 0;
  (this->m_vulkanLicenseHeader).field_2._M_local_buf[0] = '\0';
  p_Var2 = (_Base_ptr)(local_368 + 8);
  local_368._0_8_ = (pointer)0x0;
  local_368._8_8_ = 0;
  local_368._16_8_ = (_Base_ptr)0x0;
  _Stack_338.super__Rb_tree_header._M_header._M_left = &_Stack_338.super__Rb_tree_header._M_header;
  local_340 = 0;
  _Stack_338._0_8_ = 0;
  _Stack_338.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_338.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_338.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_308.super__Rb_tree_header._M_header._M_left = &_Stack_308.super__Rb_tree_header._M_header;
  _Stack_338.super__Rb_tree_header._M_node_count = 0;
  _Stack_308._0_8_ = 0;
  _Stack_308.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_308.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_308.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_308.super__Rb_tree_header._M_node_count = 0;
  local_2d8._M_p = (pointer)&local_2c8;
  local_2d0 = 0;
  local_2c8._M_local_buf[0] = '\0';
  local_2b8._M_p = (pointer)&local_2a8;
  local_2b0 = 0;
  local_2a8._M_local_buf[0] = '\0';
  local_298._M_p = (pointer)&local_288;
  local_290 = 0;
  local_288._M_local_buf[0] = '\0';
  local_278._M_p = (pointer)&local_268;
  local_270 = 0;
  local_268._M_local_buf[0] = '\0';
  local_258._M_p = (pointer)&local_248;
  local_250 = 0;
  local_248._M_local_buf[0] = '\0';
  local_238.super__Rb_tree_header._M_header._M_left = &local_238.super__Rb_tree_header._M_header;
  local_238._0_8_ = 0;
  local_238.super__Rb_tree_header._M_header._M_color = _S_red;
  local_238.super__Rb_tree_header._M_header._4_4_ = 0;
  local_238.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_238.super__Rb_tree_header._M_node_count = 0;
  local_208 = false;
  local_204 = 0;
  uStack_1fc = 0;
  local_1f4 = 0;
  uStack_1ec = 0;
  local_1e4 = 0;
  local_368._24_8_ = p_Var2;
  local_348 = p_Var2;
  _Stack_338.super__Rb_tree_header._M_header._M_right =
       _Stack_338.super__Rb_tree_header._M_header._M_left;
  _Stack_308.super__Rb_tree_header._M_header._M_right =
       _Stack_308.super__Rb_tree_header._M_header._M_left;
  local_238.super__Rb_tree_header._M_header._M_right =
       local_238.super__Rb_tree_header._M_header._M_left;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  ::pair<const_char_(&)[1],_true>(&local_1d8,(char (*) [1])0x1d1ed6,(HandleData *)local_368);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>>>
              *)&this->m_handles,&local_1d8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  ::~pair(&local_1d8);
  HandleData::~HandleData((HandleData *)local_368);
  line = (document->super_XMLNode)._parseLineNum;
  getChildElements<tinyxml2::XMLDocument>(&elements,document);
  local_469 = true;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  ::pair<const_char_(&)[9],_bool,_true>(&local_390,(char (*) [9])"registry",&local_469);
  __l._M_len = 1;
  __l._M_array = &local_390;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)&local_1d8,__l,&local_46a,&local_46b);
  local_368._0_8_ = (pointer)0x0;
  local_368._8_8_ = 0;
  local_368._16_8_ = (_Base_ptr)0x0;
  local_340 = 0;
  local_368._24_8_ = p_Var2;
  local_348 = p_Var2;
  checkElements(line,&elements,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)&local_1d8,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_368);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_368);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_390);
  lVar6 = (long)elements.
                super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)elements.
                super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::to_string(&local_390.first,lVar6 >> 3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                 "encountered ",&local_390.first);
  std::operator+(&local_1d8.first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                 " elements named <registry> but only one is allowed");
  checkForError(lVar6 == 8,line,&local_1d8.first);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)local_368);
  std::__cxx11::string::~string((string *)&local_390);
  this_00 = (VulkanHppGenerator *)
            *elements.
             super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  readRegistry(this,(XMLElement *)this_00);
  filterLenMembers(this);
  checkCorrectness(this);
  handleRemovals(this);
  pFVar3 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (requiredBy = (this->m_features).
                    super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
                    ._M_impl.super__Vector_impl_data._M_start; requiredBy != pFVar3;
      requiredBy = requiredBy + 1) {
    this_00 = (VulkanHppGenerator *)&requiredBy->requireData;
    addCommandsToHandle(this,(vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                              *)this_00);
    addMissingFlagBits(this,(vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                             *)this_00,&requiredBy->name);
  }
  pEVar4 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar5 = (this->m_extensions).
                super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar4; pEVar5 = pEVar5 + 1) {
    this_00 = (VulkanHppGenerator *)&pEVar5->requireData;
    addCommandsToHandle(this,(vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                              *)this_00);
    addMissingFlagBits(this,(vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                             *)this_00,&pEVar5->name);
  }
  partitionDefines((DefinesPartition *)&local_1d8,this_00,local_468);
  DefinesPartition::operator=(&this->m_definesPartition,(DefinesPartition *)&local_1d8);
  DefinesPartition::~DefinesPartition((DefinesPartition *)&local_1d8);
  std::_Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>::
  ~_Vector_base(&elements.
                 super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
               );
  return;
}

Assistant:

VulkanHppGenerator::VulkanHppGenerator( tinyxml2::XMLDocument const & document, std::string const & api ) : m_api( api )
{
  // insert the default "handle" without class (for createInstance, and such)
  m_handles.insert( { "", {} } );

  // read the document and check its correctness
  const int                                 line     = document.GetLineNum();
  std::vector<tinyxml2::XMLElement const *> elements = getChildElements( &document );
  checkElements( line, elements, { { "registry", true } } );
  checkForError( elements.size() == 1, line, "encountered " + std::to_string( elements.size() ) + " elements named <registry> but only one is allowed" );
  readRegistry( elements[0] );
  filterLenMembers();
  checkCorrectness();
  handleRemovals();

  // add the commands to the respective handles
  // some "FlagBits" enums are not specified, but needed for our "Flags" handling -> add them here
  for ( auto & feature : m_features )
  {
    addCommandsToHandle( feature.requireData );
    addMissingFlagBits( feature.requireData, feature.name );
  }
  for ( auto & extension : m_extensions )
  {
    addCommandsToHandle( extension.requireData );
    addMissingFlagBits( extension.requireData, extension.name );
  }

  m_definesPartition = partitionDefines( m_defines );
}